

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

EnumDescriptor * __thiscall
google::protobuf::Descriptor::FindEnumTypeByName(Descriptor *this,string *key)

{
  char *__s1;
  long lVar1;
  ulong uVar2;
  char cVar3;
  int iVar4;
  EnumDescriptor *pEVar5;
  long *plVar6;
  long lVar7;
  char *pcVar8;
  long *plVar9;
  
  __s1 = (key->_M_dataplus)._M_p;
  cVar3 = *__s1;
  if (cVar3 == '\0') {
    lVar7 = 0;
  }
  else {
    lVar7 = 0;
    pcVar8 = __s1;
    do {
      pcVar8 = pcVar8 + 1;
      lVar7 = (long)cVar3 + lVar7 * 5;
      cVar3 = *pcVar8;
    } while (cVar3 != '\0');
  }
  lVar1 = *(long *)(*(long *)(*(long *)(this + 0x10) + 0x90) + 8);
  uVar2 = *(ulong *)(*(long *)(*(long *)(this + 0x10) + 0x90) + 0x10);
  plVar6 = *(long **)(lVar1 + ((ulong)((long)this * 0xffff + lVar7) % uVar2) * 8);
  plVar9 = (long *)0x0;
  if (plVar6 != (long *)0x0) {
    do {
      if (((Descriptor *)*plVar6 == this) &&
         (iVar4 = strcmp(__s1,(char *)plVar6[1]), plVar9 = plVar6, iVar4 == 0)) break;
      plVar6 = (long *)plVar6[4];
      plVar9 = (long *)0x0;
    } while (plVar6 != (long *)0x0);
  }
  if (plVar9 == (long *)0x0) {
    plVar9 = *(long **)(lVar1 + uVar2 * 8);
  }
  plVar6 = plVar9 + 2;
  if (plVar9 == *(long **)(lVar1 + uVar2 * 8)) {
    plVar6 = (long *)&(anonymous_namespace)::kNullSymbol;
  }
  pEVar5 = (EnumDescriptor *)0x0;
  if ((anonymous_namespace)::kNullSymbol != 0) {
    pEVar5 = DAT_002975f8;
  }
  if ((int)*plVar6 == 3) {
    pEVar5 = (EnumDescriptor *)plVar6[1];
  }
  return pEVar5;
}

Assistant:

const EnumDescriptor*
Descriptor::FindEnumTypeByName(const string& key) const {
  Symbol result =
    file()->tables_->FindNestedSymbolOfType(this, key, Symbol::ENUM);
  if (!result.IsNull()) {
    return result.enum_descriptor;
  } else {
    return NULL;
  }
}